

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  int *piVar1;
  ImFont *pIVar2;
  ImFont **ppIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  
  if (0 < (this->Fonts).Size) {
    lVar5 = 0;
    do {
      ImFont::~ImFont((this->Fonts).Data[lVar5]);
      if ((this->Fonts).Size <= lVar5) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,"value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
      }
      pIVar2 = (this->Fonts).Data[lVar5];
      if (pIVar2 != (ImFont *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar2);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->Fonts).Size);
  }
  ppIVar3 = (this->Fonts).Data;
  if (ppIVar3 != (ImFont **)0x0) {
    (this->Fonts).Size = 0;
    pIVar4 = GImGui;
    (this->Fonts).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar4->IO).MemFreeFn)(ppIVar3);
    (this->Fonts).Data = (ImFont **)0x0;
  }
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    for (int i = 0; i < Fonts.Size; i++)
    {
        Fonts[i]->~ImFont();
        ImGui::MemFree(Fonts[i]);
    }
    Fonts.clear();
}